

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Cluster.cpp
# Opt level: O0

Cluster * __thiscall amrex::Cluster::chop(Cluster *this)

{
  Cut __pred;
  int *piVar1;
  IntVect *pIVar2;
  Cluster *len_00;
  Box *in_RDI;
  IntVect IVar3;
  IntVect *prt_it;
  int nhi;
  int i;
  int nlo;
  int mincutlen;
  int minlen;
  int n_2;
  int dir;
  int n_1;
  IntVect cut;
  CutStatus status [3];
  CutStatus mincut;
  int *p;
  int n;
  Array<Vector<int>,_3> hist;
  IntVect len;
  int *hi;
  int *lo;
  size_type in_stack_fffffffffffffe38;
  array<amrex::Vector<int,_std::allocator<int>_>,_3UL> *in_stack_fffffffffffffe40;
  Box *in_stack_fffffffffffffe48;
  array<amrex::Vector<int,_std::allocator<int>_>,_3UL> *in_stack_fffffffffffffe50;
  Cluster *this_00;
  IntVect *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  Cut local_180;
  IntVect *local_170;
  int local_164;
  int local_160;
  int local_15c;
  int in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  int in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  int iVar4;
  undefined4 in_stack_fffffffffffffeb8;
  int iVar5;
  undefined4 in_stack_fffffffffffffebc;
  int dir_00;
  int iVar6;
  int in_stack_fffffffffffffec4;
  int aiStack_130 [4];
  long local_120;
  int local_118;
  undefined4 local_114;
  undefined4 local_110;
  undefined4 local_fc;
  int local_b0 [3];
  undefined8 local_a0;
  int local_98;
  int *local_90;
  int *local_88;
  undefined4 local_74;
  undefined8 *local_70;
  undefined4 local_64;
  undefined8 *local_60;
  undefined4 local_54;
  undefined8 *local_50;
  long local_48;
  int local_3c;
  undefined1 *local_38;
  int local_2c;
  undefined1 *local_28;
  int local_1c;
  undefined1 *local_18;
  int local_c;
  undefined1 *local_8;
  
  local_88 = Box::loVect(in_RDI);
  local_90 = Box::hiVect(in_RDI);
  IVar3 = Box::size(in_stack_fffffffffffffe48);
  local_b0[2] = IVar3.vect[2];
  local_98 = local_b0[2];
  local_b0._0_8_ = IVar3.vect._0_8_;
  local_a0._0_4_ = local_b0[0];
  local_a0._4_4_ = local_b0[1];
  local_b0 = IVar3.vect;
  std::array<amrex::Vector<int,_std::allocator<int>_>,_3UL>::array(in_stack_fffffffffffffe50);
  std::array<amrex::Vector<int,_std::allocator<int>_>,_3UL>::operator[]
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  local_50 = &local_a0;
  local_54 = 0;
  local_fc = 0;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_RDI,
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             in_stack_fffffffffffffe60->vect);
  std::array<amrex::Vector<int,_std::allocator<int>_>,_3UL>::operator[]
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  local_60 = &local_a0;
  local_64 = 1;
  local_110 = 0;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_RDI,
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             in_stack_fffffffffffffe60->vect);
  std::array<amrex::Vector<int,_std::allocator<int>_>,_3UL>::operator[]
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  local_70 = &local_a0;
  local_74 = 2;
  local_114 = 0;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_RDI,
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             in_stack_fffffffffffffe60->vect);
  for (local_118 = 0; (long)local_118 < *(long *)in_RDI[1].bigend.vect; local_118 = local_118 + 1) {
    local_120 = *(long *)(in_RDI[1].smallend.vect + 1) + (long)local_118 * 0xc;
    local_48 = local_120;
    std::array<amrex::Vector<int,_std::allocator<int>_>,_3UL>::operator[]
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    piVar1 = Vector<int,_std::allocator<int>_>::operator[]
                       (in_stack_fffffffffffffe40->_M_elems,in_stack_fffffffffffffe38);
    *piVar1 = *piVar1 + 1;
    std::array<amrex::Vector<int,_std::allocator<int>_>,_3UL>::operator[]
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    piVar1 = Vector<int,_std::allocator<int>_>::operator[]
                       (in_stack_fffffffffffffe40->_M_elems,in_stack_fffffffffffffe38);
    *piVar1 = *piVar1 + 1;
    std::array<amrex::Vector<int,_std::allocator<int>_>,_3UL>::operator[]
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    piVar1 = Vector<int,_std::allocator<int>_>::operator[]
                       (in_stack_fffffffffffffe40->_M_elems,in_stack_fffffffffffffe38);
    *piVar1 = *piVar1 + 1;
  }
  aiStack_130[3] = 3;
  IntVect::IntVect((IntVect *)&stack0xfffffffffffffec4);
  for (iVar6 = 0; iVar6 < 3; iVar6 = iVar6 + 1) {
    std::array<amrex::Vector<int,_std::allocator<int>_>,_3UL>::operator[]
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x1642141);
    in_stack_fffffffffffffe6c =
         FindCut((int *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                 in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0,
                 (CutStatus *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    local_8 = &stack0xfffffffffffffec4;
    local_c = iVar6;
    *(int *)(&stack0xfffffffffffffec4 + (long)iVar6 * 4) = in_stack_fffffffffffffe6c;
    if (aiStack_130[iVar6] < aiStack_130[3]) {
      aiStack_130[3] = aiStack_130[iVar6];
    }
  }
  dir_00 = -1;
  iVar4 = -1;
  for (iVar5 = 0; iVar5 < 3; iVar5 = iVar5 + 1) {
    if (aiStack_130[iVar5] == aiStack_130[3]) {
      local_28 = &stack0xfffffffffffffec4;
      local_2c = iVar5;
      local_1c = iVar5;
      local_18 = local_28;
      in_stack_fffffffffffffe60 =
           (IntVect *)std::min<int>((int *)&stack0xfffffffffffffeac,(int *)&stack0xfffffffffffffea8)
      ;
      if (iVar4 <= in_stack_fffffffffffffe60->vect[0]) {
        iVar4 = in_stack_fffffffffffffe60->vect[0];
        dir_00 = iVar5;
      }
    }
  }
  local_15c = 0;
  for (local_160 = local_88[dir_00]; local_38 = &stack0xfffffffffffffec4, local_3c = dir_00,
      local_160 < *(int *)(local_38 + (long)dir_00 * 4); local_160 = local_160 + 1) {
    std::array<amrex::Vector<int,_std::allocator<int>_>,_3UL>::operator[]
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    piVar1 = Vector<int,_std::allocator<int>_>::operator[]
                       (in_stack_fffffffffffffe40->_M_elems,in_stack_fffffffffffffe38);
    local_15c = *piVar1 + local_15c;
  }
  local_164 = in_RDI[1].bigend.vect[0] - local_15c;
  this_00 = *(Cluster **)(in_RDI[1].smallend.vect + 1);
  pIVar2 = &(this_00->m_bx).smallend + *(long *)in_RDI[1].bigend.vect;
  anon_unknown_8::Cut::Cut(&local_180,(IntVect *)&stack0xfffffffffffffec4,dir_00);
  __pred.m_cut.vect[1] = in_stack_fffffffffffffe6c;
  __pred.m_cut.vect[0] = in_stack_fffffffffffffe68;
  __pred._8_8_ = in_RDI;
  pIVar2 = std::partition<amrex::IntVect*,amrex::(anonymous_namespace)::Cut>
                     (in_stack_fffffffffffffe60,pIVar2,__pred);
  *(long *)in_RDI[1].bigend.vect = (long)local_15c;
  local_170 = pIVar2;
  minBox((Cluster *)CONCAT44(in_stack_fffffffffffffec4,iVar6));
  len_00 = (Cluster *)operator_new(0x30);
  Cluster(this_00,pIVar2,(Long)len_00);
  std::array<amrex::Vector<int,_std::allocator<int>_>,_3UL>::~array
            ((array<amrex::Vector<int,_std::allocator<int>_>,_3UL> *)this_00);
  return len_00;
}

Assistant:

Cluster*
Cluster::chop ()
{
    BL_ASSERT(m_len > 1);
    BL_ASSERT(!(m_ar == 0));

    const int*    lo  = m_bx.loVect();
    const int*    hi  = m_bx.hiVect();
    const IntVect len = m_bx.size();
    //
    // Compute histogram.
    //
    Array<Vector<int>,AMREX_SPACEDIM> hist;
    AMREX_D_TERM(hist[0].resize(len[0], 0);,
                 hist[1].resize(len[1], 0);,
                 hist[2].resize(len[2], 0);)
    for (int n = 0; n < m_len; n++)
    {
        const int* p = m_ar[n].getVect();
        AMREX_D_TERM( hist[0][p[0]-lo[0]]++;,
                hist[1][p[1]-lo[1]]++;,
                hist[2][p[2]-lo[2]]++; )
     }
    //
    // Find cutpoint and cutstatus in each index direction.
    //
    CutStatus mincut = InvalidCut;
    CutStatus status[AMREX_SPACEDIM];
    IntVect cut;
    for (int n = 0; n < AMREX_SPACEDIM; n++)
    {
        cut[n] = FindCut(hist[n].data(), lo[n], hi[n], status[n]);
        if (status[n] < mincut)
        {
            mincut = status[n];
        }
    }
    BL_ASSERT(mincut != InvalidCut);
    //
    // Select best cutpoint and direction.
    //
    int dir = -1;
    for (int n = 0, minlen = -1; n < AMREX_SPACEDIM; n++)
    {
        if (status[n] == mincut)
        {
            int mincutlen = std::min(cut[n]-lo[n],hi[n]-cut[n]);
            if (mincutlen >= minlen)
            {
                dir = n;
                minlen = mincutlen;
            }
        }
    }
    BL_ASSERT(dir >= 0 && dir < AMREX_SPACEDIM);

    int nlo = 0;
    for (int i = lo[dir]; i < cut[dir]; i++) {
        nlo += hist[dir][i-lo[dir]];
    }

    BL_ASSERT(nlo > 0 && nlo < m_len);

    int nhi = m_len - nlo;

    IntVect* prt_it = std::partition(m_ar, m_ar+m_len, Cut(cut,dir));

    BL_ASSERT((prt_it-m_ar) == nlo);
    BL_ASSERT(((m_ar+m_len)-prt_it) == nhi);

    m_len = nlo;
    minBox();

    return new Cluster(prt_it, nhi);
}